

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interpreter.c
# Opt level: O1

Cpu_Register get_cb_register(CB_Code opcode)

{
  Cpu_Register CVar1;
  
  CVar1 = Register_A;
  if ((opcode & CB_Code_RRC_A) < CB_Code_RRC_ADDR_HL) {
    CVar1 = *(Cpu_Register *)(&DAT_00107c44 + (ulong)(opcode & CB_Code_RRC_A) * 4);
  }
  return CVar1;
}

Assistant:

Cpu_Register get_cb_register(CB_Code opcode) {
    uint8_t lower = (uint8_t) (opcode) & 0x0F;

    switch(lower) {
        case 0x00:
        case 0x08:
            return Register_B;
        case 0x01:
        case 0x09:
            return Register_C;
        case 0x02:
        case 0x0A:
            return Register_D;
        case 0x03:
        case 0x0B:
            return Register_E;
        case 0x04:
        case 0x0C:
            return Register_H;
        case 0x05:
        case 0x0D:
            return Register_L;
        case 0x07:
        case 0x0E:
        default:
            return Register_A;
    }
}